

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::_q_processFocusChanged(QMdiSubWindowPrivate *this,QWidget *old,QWidget *now)

{
  bool bVar1;
  QWidget *child;
  QWidget *in_RDX;
  QMdiSubWindowPrivate *in_RDI;
  QMdiSubWindowPrivate *unaff_retaddr;
  QMdiSubWindow *q;
  bool in_stack_0000004e;
  bool in_stack_0000004f;
  QMdiSubWindowPrivate *in_stack_00000050;
  
  child = &q_func(in_RDI)->super_QWidget;
  if ((in_RDX != (QWidget *)0x0) &&
     ((in_RDX == child || (bVar1 = QWidget::isAncestorOf(in_RDX,child), bVar1)))) {
    if ((in_RDX == child) && ((in_RDI->isInInteractiveMode & 1U) == 0)) {
      setFocusWidget(unaff_retaddr);
    }
    setActive(in_stack_00000050,in_stack_0000004f,in_stack_0000004e);
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::_q_processFocusChanged(QWidget *old, QWidget *now)
{
    Q_UNUSED(old);
    Q_Q(QMdiSubWindow);
    if (now && (now == q || q->isAncestorOf(now))) {
        if (now == q && !isInInteractiveMode)
            setFocusWidget();
        setActive(true);
    }
}